

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

void __thiscall
qpdf_update_all_pages_cache::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,qpdf_data q)

{
  element_type *this_00;
  qpdf_data q_local;
  anon_class_1_0_00000001 *this_local;
  
  this_00 = std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)q);
  QPDF::updateAllPagesCache(this_00);
  return;
}

Assistant:

int
qpdf_find_page_by_id(qpdf_data qpdf, int objid, int generation)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_find_page_by_id");
    int n = -1;
    QPDFObjGen og(objid, generation);
    QPDF_ERROR_CODE code =
        trap_errors(qpdf, [&n, &og](qpdf_data q) { n = QIntC::to_int(q->qpdf->findPage(og)); });
    if (code & QPDF_ERRORS) {
        return -1;
    }
    return n;
}